

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DOMRangeImpl::isLegalContainedNode(DOMRangeImpl *this,DOMNode *node)

{
  int iVar1;
  DOMNode *node_local;
  DOMRangeImpl *this_local;
  
  if (node == (DOMNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = (*node->_vptr_DOMNode[4])();
    if ((((iVar1 == 2) || (iVar1 == 6)) || (iVar1 == 9)) || (iVar1 == 0xb || iVar1 == 0xc)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DOMRangeImpl::isLegalContainedNode(const DOMNode* node ) const {
   if ( node==0 )
       return false;
   switch( node->getNodeType() )
   {
       case DOMNode::DOCUMENT_NODE:
       case DOMNode::DOCUMENT_FRAGMENT_NODE:
       case DOMNode::ATTRIBUTE_NODE:
       case DOMNode::ENTITY_NODE:
       case DOMNode::NOTATION_NODE:
            return false;
       default:
            return true;
   }   
}